

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::Expand
               (VNode *vnode,BeliefLowerBound *lower_bound,BeliefUpperBound *upper_bound,
               BeliefMDP *model,History *history)

{
  int iVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  void *pvVar5;
  QNode *this;
  QNode *local_48;
  QNode *qnode;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvStack_38;
  ACT_TYPE action;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *children;
  History *history_local;
  BeliefMDP *model_local;
  BeliefUpperBound *upper_bound_local;
  BeliefLowerBound *lower_bound_local;
  VNode *vnode_local;
  
  children = (vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *)history;
  history_local = (History *)model;
  model_local = (BeliefMDP *)upper_bound;
  upper_bound_local = (BeliefUpperBound *)lower_bound;
  lower_bound_local = (BeliefLowerBound *)vnode;
  pvStack_38 = VNode::children(vnode);
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"- Expanding vnode ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,lower_bound_local);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  for (qnode._4_4_ = 0; iVar1 = qnode._4_4_,
      iVar2 = (**(code **)((history_local->actions_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 10))(), iVar1 < iVar2;
      qnode._4_4_ = qnode._4_4_ + 1) {
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Action ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,qnode._4_4_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    this = (QNode *)operator_new(0x88);
    QNode::QNode(this,(VNode *)lower_bound_local,qnode._4_4_);
    local_48 = this;
    std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::push_back(pvStack_38,&local_48);
    Expand(local_48,(BeliefLowerBound *)upper_bound_local,(BeliefUpperBound *)model_local,
           (BeliefMDP *)history_local,(History *)children);
  }
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"* Expansion complete!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void AEMS::Expand(VNode* vnode, BeliefLowerBound* lower_bound,
	BeliefUpperBound* upper_bound, const BeliefMDP* model, History& history) {
	vector<QNode*>& children = vnode->children();
	logd << "- Expanding vnode " << vnode << endl;
	for (ACT_TYPE action = 0; action < model->NumActions(); action++) {
		logd << " Action " << action << endl;
		QNode* qnode = new QNode(vnode, action);
		children.push_back(qnode);

		Expand(qnode, lower_bound, upper_bound, model, history);
	}
	logd << "* Expansion complete!" << endl;
}